

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssnode_bmod.c
# Opt level: O2

int ssnode_bmod(int jcol,int jsupno,int fsupc,float *dense,float *tempv,GlobalLU_t *Glu,
               SuperLUStat_t *stat)

{
  int iVar1;
  flops_t *pfVar2;
  int_t *piVar3;
  int_t *piVar4;
  void *pvVar5;
  int_t *piVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  uint nrow;
  ulong uVar13;
  
  pfVar2 = stat->ops;
  piVar3 = Glu->lsub;
  piVar4 = Glu->xlsub;
  pvVar5 = Glu->lusup;
  piVar6 = Glu->xlusup;
  iVar1 = piVar6[jcol];
  iVar12 = piVar4[(long)fsupc + 1];
  pfVar11 = (float *)((long)pvVar5 + (long)iVar1 * 4);
  iVar9 = iVar1;
  for (lVar10 = (long)piVar4[fsupc]; lVar10 < iVar12; lVar10 = lVar10 + 1) {
    iVar8 = piVar3[lVar10];
    *pfVar11 = dense[iVar8];
    dense[iVar8] = 0.0;
    iVar9 = iVar9 + 1;
    pfVar11 = pfVar11 + 1;
  }
  piVar6[(long)jcol + 1] = iVar9;
  iVar12 = jcol - fsupc;
  if (iVar12 != 0 && fsupc <= jcol) {
    iVar8 = piVar4[(long)fsupc + 1] - piVar4[fsupc];
    nrow = iVar8 - iVar12;
    iVar9 = piVar6[fsupc];
    pfVar2[0x13] = (float)((iVar12 + -1) * iVar12) + pfVar2[0x13];
    pfVar2[0x14] = (float)(int)(iVar12 * nrow * 2) + pfVar2[0x14];
    pfVar11 = (float *)((long)pvVar5 + (long)iVar1 * 4);
    slsolve(iVar8,iVar12,(float *)((long)pvVar5 + (long)iVar9 * 4),pfVar11);
    smatvec(iVar8,nrow,iVar12,(float *)((long)pvVar5 + ((long)iVar9 + (long)iVar12) * 4),pfVar11,
            tempv);
    uVar7 = 0;
    uVar13 = (ulong)nrow;
    if ((int)nrow < 1) {
      uVar13 = uVar7;
    }
    for (; uVar13 != uVar7; uVar7 = uVar7 + 1) {
      *(float *)((long)pvVar5 + uVar7 * 4 + (long)(iVar1 + iVar12) * 4) =
           *(float *)((long)pvVar5 + uVar7 * 4 + (long)(iVar1 + iVar12) * 4) - tempv[uVar7];
      tempv[uVar7] = 0.0;
    }
  }
  return 0;
}

Assistant:

int
ssnode_bmod (
	    const int  jcol,	  /* in */
	    const int  jsupno,    /* in */
	    const int  fsupc,     /* in */
	    float     *dense,    /* in */
	    float     *tempv,    /* working array */
	    GlobalLU_t *Glu,      /* modified */
	    SuperLUStat_t *stat   /* output */
	    )
{
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int            incx = 1, incy = 1;
    float         alpha = -1.0, beta = 1.0;
#endif

    int     nsupc, nsupr, nrow;
    int_t   isub, irow;
    int_t   ufirst, nextlu;
    int_t   *lsub, *xlsub;
    float *lusup;
    int_t   *xlusup, luptr;
    flops_t *ops = stat->ops;

    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (float *) Glu->lusup;
    xlusup  = Glu->xlusup;

    nextlu = xlusup[jcol];
    
    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
	dense[irow] = 0;
	++nextlu;
    }

    xlusup[jcol + 1] = nextlu;	/* Initialize xlusup for next column */
    
    if ( fsupc < jcol ) {

	luptr = xlusup[fsupc];
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nsupc = jcol - fsupc;	/* Excluding jcol */
	ufirst = xlusup[jcol];	/* Points to the beginning of column
				   jcol in supernode L\U(jsupno). */
	nrow = nsupr - nsupc;

	ops[TRSV] += nsupc * (nsupc - 1);
	ops[GEMV] += 2 * nrow * nsupc;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	SGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	strsv_( "L", "N", "U", &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	sgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	slsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );
	smatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc], 
			&lusup[ufirst], &tempv[0] );

	int_t i, iptr; 
        /* Scatter tempv[*] into lusup[*] */
	iptr = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    lusup[iptr++] -= tempv[i];
	    tempv[i] = 0.0;
	}
#endif

    }

    return 0;
}